

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcUtil.c
# Opt level: O3

void Abc_NtkReverseTopoOrderTest(Abc_Ntk_t *p)

{
  Abc_Obj_t *pObj;
  int iVar1;
  Vec_Int_t *pVVar2;
  int *piVar3;
  Vec_Ptr_t *pVVar4;
  long lVar5;
  ulong uVar6;
  int iVar7;
  long lVar8;
  timespec ts;
  timespec local_40;
  
  iVar1 = clock_gettime(3,&local_40);
  if (iVar1 < 0) {
    lVar5 = 1;
  }
  else {
    lVar5 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_40.tv_nsec),8);
    lVar5 = ((lVar5 >> 7) - (lVar5 >> 0x3f)) + local_40.tv_sec * -1000000;
  }
  Abc_NtkReverseTopoOrder(p);
  pVVar2 = p->vTopo;
  if (pVVar2 != (Vec_Int_t *)0x0) {
    if (pVVar2->pArray != (int *)0x0) {
      free(pVVar2->pArray);
      p->vTopo->pArray = (int *)0x0;
      pVVar2 = p->vTopo;
      if (pVVar2 == (Vec_Int_t *)0x0) goto LAB_0087bcaa;
    }
    free(pVVar2);
    p->vTopo = (Vec_Int_t *)0x0;
  }
LAB_0087bcaa:
  iVar7 = 3;
  iVar1 = clock_gettime(3,&local_40);
  if (iVar1 < 0) {
    lVar8 = -1;
  }
  else {
    lVar8 = local_40.tv_nsec / 1000 + local_40.tv_sec * 1000000;
  }
  Abc_Print(iVar7,"%s =","Time");
  Abc_Print(iVar7,"%9.2f sec\n",(double)(lVar8 + lVar5) / 1000000.0);
  iVar1 = clock_gettime(3,&local_40);
  if (iVar1 < 0) {
    lVar5 = 1;
  }
  else {
    lVar5 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_40.tv_nsec),8);
    lVar5 = ((lVar5 >> 7) - (lVar5 >> 0x3f)) + local_40.tv_sec * -1000000;
  }
  pVVar2 = (Vec_Int_t *)malloc(0x10);
  pVVar2->nCap = 1000;
  piVar3 = (int *)malloc(4000);
  pVVar2->pArray = piVar3;
  pVVar4 = p->vObjs;
  uVar6 = (ulong)(uint)pVVar4->nSize;
  if (0 < pVVar4->nSize) {
    lVar8 = 0;
    do {
      pObj = (Abc_Obj_t *)pVVar4->pArray[lVar8];
      if ((pObj != (Abc_Obj_t *)0x0) && ((*(uint *)&pObj->field_0x14 & 0xf) == 7)) {
        pVVar2->nSize = 0;
        if ((p->vTravIds).pArray == (int *)0x0) {
          piVar3 = (int *)calloc(1,(uVar6 & 0xffffffff) * 4 + 2000);
          (p->vTravIds).pArray = piVar3;
          if (piVar3 == (int *)0x0) {
            __assert_fail("p->pArray",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                          ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
          }
          iVar1 = (int)uVar6 + 500;
          (p->vTravIds).nCap = iVar1;
          (p->vTravIds).nSize = iVar1;
        }
        iVar1 = p->nTravIds;
        p->nTravIds = iVar1 + 1;
        if (0x3ffffffe < iVar1) {
          __assert_fail("p->nTravIds < (1<<30)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abc.h"
                        ,0x198,"void Abc_NtkIncrementTravId(Abc_Ntk_t *)");
        }
        Abc_NtkReverse_rec(pObj,pVVar2);
        pVVar4 = p->vObjs;
      }
      lVar8 = lVar8 + 1;
      uVar6 = (ulong)pVVar4->nSize;
    } while (lVar8 < (long)uVar6);
    piVar3 = pVVar2->pArray;
  }
  if (piVar3 != (int *)0x0) {
    free(piVar3);
  }
  free(pVVar2);
  iVar7 = 3;
  iVar1 = clock_gettime(3,&local_40);
  if (iVar1 < 0) {
    lVar8 = -1;
  }
  else {
    lVar8 = local_40.tv_nsec / 1000 + local_40.tv_sec * 1000000;
  }
  Abc_Print(iVar7,"%s =","Time");
  Abc_Print(iVar7,"%9.2f sec\n",(double)(lVar8 + lVar5) / 1000000.0);
  return;
}

Assistant:

void Abc_NtkReverseTopoOrderTest( Abc_Ntk_t * p )
{
    Vec_Int_t * vVisited;
    Abc_Obj_t * pObj;
    int i;//, k, iBeg, iEnd;
    abctime clk = Abc_Clock();
    Abc_NtkReverseTopoOrder( p );
/*
    printf( "Reverse topological order for nodes:\n" );
    Abc_NtkForEachNode( p, pObj, i )
    {
        iBeg = Abc_NtkTopoHasBeg( pObj );
        iEnd = Abc_NtkTopoHasEnd( pObj );
        printf( "Node %4d : ", Abc_ObjId(pObj) );
        for ( k = iEnd - 1; k >= iBeg; k-- )
            printf( "%d ", Vec_IntEntry(p->vTopo, k) );
        printf( "\n" );
    }
*/
    Vec_IntFreeP( &p->vTopo );
    Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
    // compute regular fanout orders
    clk = Abc_Clock();
    vVisited = Vec_IntAlloc( 1000 );
    Abc_NtkForEachNode( p, pObj, i )
    {
        Vec_IntClear( vVisited );
        Abc_NtkIncrementTravId( p ); 
        Abc_NtkReverse_rec( pObj, vVisited );
    }
    Vec_IntFree( vVisited );
    Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
}